

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonAppendObjectPathElement(JsonString *pStr,JsonNode *pNode)

{
  uint uVar1;
  uint uVar2;
  JsonNode *pJVar3;
  ulong uVar4;
  bool bVar5;
  
  pJVar3 = (pNode->u).pPatch;
  uVar1 = pNode->n;
  uVar4 = (ulong)uVar1;
  if ((2 < (int)uVar1) && ((""[pJVar3->jnFlags] & 2) != 0)) {
    uVar2 = uVar1 - 1;
    uVar4 = 2;
    if (uVar1 != 3) {
      uVar4 = 2;
      do {
        if ((""[(&pJVar3->eType)[uVar4]] & 6) == 0) goto LAB_001c1e3c;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      uVar4 = (ulong)uVar2;
    }
LAB_001c1e3c:
    bVar5 = (uint)uVar4 != uVar2;
    uVar2 = uVar1 - 2;
    if (bVar5) {
      uVar2 = uVar1;
    }
    uVar4 = (ulong)uVar2;
    if (!bVar5) {
      pJVar3 = (JsonNode *)&pJVar3->jnFlags;
    }
  }
  jsonPrintf((int)uVar4 + 2,pStr,".%.*s",uVar4,pJVar3);
  return;
}

Assistant:

static void jsonAppendObjectPathElement(
  JsonString *pStr,
  JsonNode *pNode
){
  int jj, nn;
  const char *z;
  assert( pNode->eType==JSON_STRING );
  assert( pNode->jnFlags & JNODE_LABEL );
  assert( pNode->eU==1 );
  z = pNode->u.zJContent;
  nn = pNode->n;
  assert( nn>=2 );
  assert( z[0]=='"' );
  assert( z[nn-1]=='"' );
  if( nn>2 && sqlite3Isalpha(z[1]) ){
    for(jj=2; jj<nn-1 && sqlite3Isalnum(z[jj]); jj++){}
    if( jj==nn-1 ){
      z++;
      nn -= 2;
    }
  }
  jsonPrintf(nn+2, pStr, ".%.*s", nn, z);
}